

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int transfer_set_more(TRANSFER_HANDLE transfer,_Bool more_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  TRANSFER_INSTANCE *transfer_instance;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    iVar2 = 0x1e42;
  }
  else {
    item_value = amqpvalue_create_boolean(more_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1e4a;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,5,item_value);
      iVar2 = 0x1e50;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int transfer_set_more(TRANSFER_HANDLE transfer, bool more_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE more_amqp_value = amqpvalue_create_boolean(more_value);
        if (more_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 5, more_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(more_amqp_value);
        }
    }

    return result;
}